

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbo_linecount.cpp
# Opt level: O1

int __thiscall TURBOLINECOUNT::CLineCount::init(CLineCount *this,EVP_PKEY_CTX *ctx)

{
  pointer puVar1;
  pointer plVar2;
  
  this->m_lasterror = 0;
  std::__cxx11::string::_M_replace
            ((ulong)&this->m_lasterrorstring,0,(char *)(this->m_lasterrorstring)._M_string_length,
             0x104044);
  this->m_opened = false;
  this->m_auto_close = false;
  this->m_fh = -1;
  this->m_filesize = 0;
  this->m_actual_thread_count = 0;
  puVar1 = (this->m_threads).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_threads).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->m_threads).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  plVar2 = (this->m_threadlinecounts).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_threadlinecounts).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish != plVar2) {
    (this->m_threadlinecounts).super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = plVar2;
  }
  return (int)plVar2;
}

Assistant:

void CLineCount::init(void)
{
	m_lasterror = 0;
	m_lasterrorstring = _T("");
	m_opened = false;
	m_auto_close = false;
	m_fh = LCINVALIDHANDLE;
	m_filesize = 0;
	m_actual_thread_count = 0;
#ifdef _WIN32
	m_filemapping = NULL;
#endif
	m_threads.clear();
	m_threadlinecounts.clear();
}